

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StickyAdapter.cpp
# Opt level: O2

StickyAtypeParameters * __thiscall
OpenMD::StickyAdapter::getStickyParam
          (StickyAtypeParameters *__return_storage_ptr__,StickyAdapter *this)

{
  _func_int **pp_Var1;
  pointer pcVar2;
  RealType RVar3;
  RealType RVar4;
  RealType RVar5;
  _func_int **pp_Var6;
  size_type sVar7;
  bool bVar8;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>_> stickyData;
  shared_ptr<OpenMD::GenericData> data;
  shared_ptr<OpenMD::GenericData> local_68;
  undefined1 local_58 [16];
  string local_48;
  
  bVar8 = isSticky(this);
  if (!bVar8) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "StickyAdapter::getStickyParam was passed an atomType (%s)\n\tthat does not appear to be a Sticky atom.\n"
             ,local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_58,(string *)this->at_);
  if ((_func_int **)local_58._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "StickyAdapter::getStickyParam could not find Sticky\n\tparameters for atomType %s.\n",
             local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  std::
  dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>,OpenMD::GenericData>
            (&local_68);
  if (local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "StickyAdapter::getStickyParam could not convert\n\tGenericData to StickyAtypeData for atom type %s\n"
             ,local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  pp_Var1 = local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
            _vptr_GenericData;
  pcVar2 = local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
           id_._M_dataplus._M_p;
  RVar3 = (RealType)
          local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].id_
          ._M_string_length;
  RVar4 = (RealType)
          local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].id_
          .field_2._M_allocated_capacity;
  RVar5 = *(RealType *)
           ((long)&local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr[1].id_.field_2 + 8);
  pp_Var6 = local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
            _vptr_GenericData;
  sVar7 = local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].id_
          ._M_string_length;
  __return_storage_ptr__->rup =
       (RealType)
       local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].id_.
       _M_dataplus._M_p;
  *(size_type *)&__return_storage_ptr__->isPower = sVar7;
  __return_storage_ptr__->ru = RVar5;
  __return_storage_ptr__->rlp = (RealType)pp_Var6;
  __return_storage_ptr__->v0p = RVar3;
  __return_storage_ptr__->rl = RVar4;
  __return_storage_ptr__->w0 = (RealType)pp_Var1;
  __return_storage_ptr__->v0 = (RealType)pcVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  return __return_storage_ptr__;
}

Assistant:

StickyAtypeParameters StickyAdapter::getStickyParam() {
    if (!isSticky()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StickyAdapter::getStickyParam was passed an atomType (%s)\n"
               "\tthat does not appear to be a Sticky atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(StickyTypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StickyAdapter::getStickyParam could not find Sticky\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<StickyAtypeData> stickyData =
        std::dynamic_pointer_cast<StickyAtypeData>(data);
    if (stickyData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StickyAdapter::getStickyParam could not convert\n"
               "\tGenericData to StickyAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return stickyData->getData();
  }